

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

xmlPatternPtr xmlPatterncompile(xmlChar *pattern,xmlDict *dict,int flags,xmlChar **namespaces)

{
  _xmlPattern **pp_Var1;
  xmlPatOp xVar2;
  xmlDictPtr dict_00;
  xmlStreamStepPtr pxVar3;
  bool bVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlChar xVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  xmlPatParserContextPtr ctxt;
  _xmlPattern *p_Var12;
  xmlStepOpPtr pxVar13;
  byte *pbVar14;
  xmlStreamCompPtr pxVar15;
  xmlChar **ppxVar16;
  byte *pbVar17;
  uint uVar18;
  xmlChar *pxVar19;
  _xmlPattern *comp;
  xmlChar *pxVar20;
  ulong uVar21;
  _xmlPattern *ctxt_00;
  xmlChar **ppxVar22;
  uint flags_00;
  xmlChar *in_R8;
  uint uVar23;
  xmlPatternPtr pxVar24;
  long lVar25;
  uint local_6c;
  xmlChar *local_58;
  
  if ((pattern == (xmlChar *)0x0) || (xVar7 = *pattern, xVar7 == '\0')) {
    return (xmlPatternPtr)0x0;
  }
  uVar18 = flags | 0x200;
  uVar23 = 1;
  local_6c = 0;
  pxVar24 = (xmlPatternPtr)0x0;
LAB_0016bc04:
  lVar25 = 0;
LAB_0016bc0f:
  if (xVar7 != '\0') {
    if (xVar7 != '|') goto code_r0x0016bc1f;
    local_58 = xmlStrndup(pattern,(int)lVar25);
    if (local_58 == (xmlChar *)0x0) goto LAB_0016c6b1;
    ctxt = (xmlPatParserContextPtr)(*xmlMalloc)(0x40);
    if (ctxt != (xmlPatParserContextPtr)0x0) {
      ctxt->error = 0;
      *(undefined4 *)&ctxt->field_0x14 = 0;
      ctxt->dict = (xmlDictPtr)0x0;
      ctxt->namespaces = (xmlChar **)0x0;
      ctxt->nb_namespaces = 0;
      *(undefined4 *)&ctxt->field_0x3c = 0;
      ctxt->comp = (xmlPatternPtr)0x0;
      ctxt->elem = (xmlNodePtr)0x0;
      ctxt->dict = dict;
      ctxt->cur = local_58;
      ctxt->base = local_58;
      if (namespaces != (xmlChar **)0x0) {
        iVar9 = -1;
        ppxVar16 = namespaces;
        do {
          iVar9 = iVar9 + 1;
          pxVar20 = *ppxVar16;
          ppxVar16 = ppxVar16 + 2;
        } while (pxVar20 != (xmlChar *)0x0);
        ctxt->nb_namespaces = iVar9;
      }
      ctxt->namespaces = namespaces;
      lVar25 = lVar25 + 1;
      goto LAB_0016bd07;
    }
    goto LAB_0016c6e9;
  }
  ctxt = (xmlPatParserContextPtr)(*xmlMalloc)(0x40);
  if (ctxt != (xmlPatParserContextPtr)0x0) {
    ctxt->error = 0;
    *(undefined4 *)&ctxt->field_0x14 = 0;
    ctxt->dict = (xmlDictPtr)0x0;
    ctxt->namespaces = (xmlChar **)0x0;
    ctxt->nb_namespaces = 0;
    *(undefined4 *)&ctxt->field_0x3c = 0;
    ctxt->comp = (xmlPatternPtr)0x0;
    ctxt->elem = (xmlNodePtr)0x0;
    ctxt->dict = dict;
    ctxt->cur = pattern;
    ctxt->base = pattern;
    if (namespaces != (xmlChar **)0x0) {
      iVar9 = -1;
      ppxVar16 = namespaces;
      do {
        iVar9 = iVar9 + 1;
        pxVar20 = *ppxVar16;
        ppxVar16 = ppxVar16 + 2;
      } while (pxVar20 != (xmlChar *)0x0);
      ctxt->nb_namespaces = iVar9;
    }
    ctxt->namespaces = namespaces;
    local_58 = (xmlChar *)0x0;
LAB_0016bd07:
    pattern = pattern + lVar25;
    p_Var12 = (_xmlPattern *)(*xmlMalloc)(0x40);
    if (p_Var12 != (_xmlPattern *)0x0) {
      *(undefined1 (*) [16])&p_Var12->flags = (undefined1  [16])0x0;
      p_Var12->steps = (xmlStepOpPtr)0x0;
      p_Var12->stream = (xmlStreamCompPtr)0x0;
      p_Var12->next = (_xmlPattern *)0x0;
      p_Var12->pattern = (xmlChar *)0x0;
      p_Var12->data = (void *)0x0;
      p_Var12->dict = (xmlDictPtr)0x0;
      p_Var12->maxStep = 10;
      pxVar13 = (xmlStepOpPtr)(*xmlMalloc)(0xf0);
      p_Var12->steps = pxVar13;
      if (pxVar13 == (xmlStepOpPtr)0x0) {
        (*xmlFree)(p_Var12);
        goto LAB_0016c6c1;
      }
      if (dict != (xmlDict *)0x0) {
        p_Var12->dict = dict;
        xmlDictReference(dict);
      }
      comp = p_Var12;
      if (pxVar24 != (xmlPatternPtr)0x0) {
        p_Var12->next = pxVar24->next;
        pxVar24->next = p_Var12;
        comp = pxVar24;
      }
      p_Var12->flags = flags;
      ctxt->comp = p_Var12;
      pbVar14 = ctxt->cur;
      pbVar17 = pbVar14;
      if ((flags & 6U) != 0) {
        while( true ) {
          pbVar17 = pbVar17 + 1;
          uVar21 = (ulong)*pbVar14;
          if (0x2f < uVar21) break;
          if ((0x100002600U >> (uVar21 & 0x3f) & 1) == 0) {
            if (uVar21 == 0x2f) goto LAB_0016c241;
            break;
          }
          pbVar14 = pbVar14 + 1;
          ctxt->cur = pbVar14;
        }
        p_Var12->flags = uVar18;
        if (*pbVar14 != 0x2e) goto LAB_0016c050;
        while( true ) {
          ctxt->cur = pbVar17;
          uVar21 = (ulong)*pbVar17;
          if (0x2f < uVar21) break;
          if ((0x100002600U >> (uVar21 & 0x3f) & 1) == 0) {
            if (uVar21 == 0) {
              iVar9 = xmlPatternAdd((xmlPatParserContextPtr)p_Var12,(xmlPatternPtr)&DAT_00000002,
                                    XML_OP_END,(xmlChar *)0x0,in_R8);
              if (iVar9 == 0) goto LAB_0016c248;
            }
            else if (uVar21 == 0x2f) goto LAB_0016be41;
            break;
          }
          pbVar17 = pbVar17 + 1;
        }
        goto LAB_0016c241;
      }
      while( true ) {
        pbVar17 = pbVar14 + 1;
        bVar8 = *pbVar14;
        uVar21 = (ulong)bVar8;
        if (0x2f < uVar21) break;
        if ((0x100002600U >> (uVar21 & 0x3f) & 1) == 0) {
          uVar10 = uVar18;
          if ((uVar21 == 0x2e) || (uVar10 = flags | 0x100, uVar21 == 0x2f)) goto LAB_0016bea6;
          break;
        }
        ctxt->cur = pbVar17;
        pbVar14 = pbVar17;
      }
      uVar10 = uVar18;
      if ((flags & 1U) != 0) {
LAB_0016bea6:
        p_Var12->flags = uVar10;
        bVar8 = *pbVar14;
      }
      if (bVar8 != 0x2e) {
        if (bVar8 == 0x2f) {
          ctxt_00 = p_Var12;
          if (*pbVar17 == 0x2f) {
            iVar9 = xmlPatternAdd((xmlPatParserContextPtr)p_Var12,(xmlPatternPtr)&DAT_00000006,
                                  XML_OP_END,(xmlChar *)0x0,in_R8);
            if (iVar9 != 0) goto LAB_0016c248;
            pxVar20 = ctxt->cur;
            if ((*pxVar20 == '\0') || (ctxt->cur = pxVar20 + 1, pxVar20[1] == '\0'))
            goto LAB_0016c14b;
            pbVar14 = pxVar20 + 2;
            ctxt->cur = pbVar14;
            bVar8 = pxVar20[2];
            goto LAB_0016bf7e;
          }
LAB_0016bf96:
          iVar9 = xmlPatternAdd((xmlPatParserContextPtr)ctxt_00,(xmlPatternPtr)&DAT_00000001,
                                XML_OP_END,(xmlChar *)0x0,in_R8);
          if (iVar9 == 0) {
            pbVar14 = ctxt->cur;
            if (*pbVar14 != 0) goto LAB_0016c13a;
            while (uVar21 = (ulong)*pbVar14, uVar21 < 0x21) {
              if ((0x100002600U >> (uVar21 & 0x3f) & 1) == 0) {
                if (uVar21 == 0) goto LAB_0016c241;
                break;
              }
LAB_0016c13a:
              pbVar14 = pbVar14 + 1;
              ctxt->cur = pbVar14;
            }
            goto LAB_0016c14b;
          }
          goto LAB_0016c248;
        }
LAB_0016bf7e:
        if (bVar8 != 0x40) {
          if (bVar8 != 0x2f) goto LAB_0016c14b;
          ctxt_00 = ctxt->comp;
          goto LAB_0016bf96;
        }
        ctxt->cur = pbVar14 + 1;
        xmlCompileAttributeTest(ctxt);
        pbVar14 = ctxt->cur;
        while( true ) {
          uVar21 = (ulong)*pbVar14;
          if (0x20 < uVar21) break;
          if ((0x100002600U >> (uVar21 & 0x3f) & 1) == 0) {
            if (uVar21 == 0) goto LAB_0016c248;
            break;
          }
          ctxt->cur = pbVar14 + 1;
          pbVar14 = pbVar14 + 1;
        }
        xmlCompileStepPattern(ctxt);
        if (ctxt->error != 0) goto LAB_0016c248;
        bVar8 = *ctxt->cur;
        goto LAB_0016c239;
      }
      if ((*pbVar17 == 0x2f) && (pbVar14[2] == 0x2f)) {
        iVar9 = xmlPatternAdd((xmlPatParserContextPtr)p_Var12,(xmlPatternPtr)&DAT_00000006,
                              XML_OP_END,(xmlChar *)0x0,in_R8);
        if (iVar9 == 0) {
          pbVar17 = ctxt->cur;
          pbVar14 = pbVar17;
          if (*pbVar17 == 0) goto LAB_0016c0fb;
          ctxt->cur = pbVar17 + 1;
          pbVar14 = pbVar17 + 1;
          if (pbVar17[1] == 0) goto LAB_0016c0fb;
          ctxt->cur = pbVar17 + 2;
          pbVar14 = pbVar17 + 2;
          if (pbVar17[2] == 0) goto LAB_0016c0fb;
          pbVar14 = pbVar17 + 3;
          while( true ) {
            ctxt->cur = pbVar14;
LAB_0016c0fb:
            bVar8 = *pbVar14;
            uVar21 = (ulong)bVar8;
            if (0x20 < uVar21) goto LAB_0016bf7e;
            if ((0x100002600U >> (uVar21 & 0x3f) & 1) == 0) break;
            pbVar14 = pbVar14 + 1;
          }
          if (uVar21 == 0) goto LAB_0016c241;
          goto LAB_0016bf7e;
        }
      }
      else {
LAB_0016c14b:
        xmlCompileStepPattern(ctxt);
        if (ctxt->error == 0) {
          pbVar14 = ctxt->cur;
          while( true ) {
            bVar8 = *pbVar14;
            uVar21 = (ulong)bVar8;
            if (0x2f < uVar21) break;
            if ((0x100002600U >> (uVar21 & 0x3f) & 1) == 0) {
              if (uVar21 == 0x2f) goto LAB_0016c189;
              break;
            }
            pbVar14 = pbVar14 + 1;
            ctxt->cur = pbVar14;
          }
          goto LAB_0016c239;
        }
      }
      goto LAB_0016c248;
    }
    goto LAB_0016c6c1;
  }
LAB_0016c6b1:
  local_58 = (xmlChar *)0x0;
  goto LAB_0016c6e9;
code_r0x0016bc1f:
  xVar7 = pattern[lVar25 + 1];
  lVar25 = lVar25 + 1;
  goto LAB_0016bc0f;
  while ((0x100002600U >> (uVar21 & 0x3f) & 1) != 0) {
LAB_0016be41:
    pbVar14 = pbVar17;
    pbVar17 = pbVar14 + 1;
    ctxt->cur = pbVar17;
    bVar8 = *pbVar17;
    uVar21 = (ulong)bVar8;
    if (0x2f < uVar21) goto LAB_0016c048;
  }
  if (uVar21 == 0x2f) {
    uVar21 = (ulong)*pbVar14;
    if (((uVar21 < 0x21) && ((0x100002600U >> (uVar21 & 0x3f) & 1) != 0)) ||
       (iVar9 = xmlPatternAdd((xmlPatParserContextPtr)p_Var12,(xmlPatternPtr)&DAT_00000006,
                              XML_OP_END,(xmlChar *)0x0,in_R8), iVar9 != 0)) goto LAB_0016c241;
    pbVar14 = ctxt->cur;
    if (*pbVar14 != 0) goto LAB_0016c040;
    while( true ) {
      bVar8 = *pbVar14;
      if ((0x20 < (ulong)bVar8) || ((0x100002600U >> ((ulong)bVar8 & 0x3f) & 1) == 0)) break;
LAB_0016c040:
      pbVar14 = pbVar14 + 1;
      ctxt->cur = pbVar14;
    }
  }
LAB_0016c048:
  if (bVar8 != 0) {
LAB_0016c050:
    xmlCompileStepPattern(ctxt);
    if (ctxt->error == 0) {
      while( true ) {
        pbVar14 = ctxt->cur;
        while( true ) {
          uVar21 = (ulong)*pbVar14;
          if (0x2f < uVar21) goto LAB_0016c241;
          if ((0x100002600U >> (uVar21 & 0x3f) & 1) == 0) break;
          ctxt->cur = pbVar14 + 1;
          pbVar14 = pbVar14 + 1;
        }
        if (uVar21 == 0) goto LAB_0016c248;
        if ((uVar21 != 0x2f) ||
           (iVar9 = xmlPatternAdd((xmlPatParserContextPtr)ctxt->comp,(xmlPatternPtr)&DAT_00000005,
                                  XML_OP_END,(xmlChar *)0x0,in_R8), iVar9 != 0)) break;
        pbVar14 = ctxt->cur;
        if (*pbVar14 != 0) goto LAB_0016c0c9;
        while (uVar21 = (ulong)*pbVar14, uVar21 < 0x30) {
          if ((0x100002600U >> (uVar21 & 0x3f) & 1) == 0) {
            if ((uVar21 == 0) || (uVar21 == 0x2f)) goto LAB_0016c241;
            break;
          }
LAB_0016c0c9:
          pbVar14 = pbVar14 + 1;
          ctxt->cur = pbVar14;
        }
        xmlCompileStepPattern(ctxt);
        if (ctxt->error != 0) break;
      }
    }
  }
LAB_0016c241:
  ctxt->error = 1;
  goto LAB_0016c248;
LAB_0016c189:
  do {
    if (pbVar14[1] == 0x2f) {
      iVar9 = xmlPatternAdd((xmlPatParserContextPtr)ctxt->comp,(xmlPatternPtr)&DAT_00000006,
                            XML_OP_END,(xmlChar *)0x0,in_R8);
      if (iVar9 != 0) goto LAB_0016c248;
      pbVar14 = ctxt->cur;
      pbVar17 = pbVar14;
      if (*pbVar14 == 0) goto LAB_0016c206;
      ctxt->cur = pbVar14 + 1;
      pbVar17 = pbVar14 + 1;
      if (pbVar14[1] == 0) goto LAB_0016c206;
      pbVar17 = pbVar14 + 2;
      while( true ) {
        ctxt->cur = pbVar17;
LAB_0016c206:
        if ((0x20 < (ulong)*pbVar17) || ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0))
        break;
        pbVar17 = pbVar17 + 1;
      }
    }
    else {
      iVar9 = xmlPatternAdd((xmlPatParserContextPtr)ctxt->comp,(xmlPatternPtr)&DAT_00000005,
                            XML_OP_END,(xmlChar *)0x0,in_R8);
      if (iVar9 != 0) goto LAB_0016c248;
      pbVar14 = ctxt->cur;
      if (*pbVar14 != 0) goto LAB_0016c1f7;
      while (uVar21 = (ulong)*pbVar14, uVar21 < 0x21) {
        if ((0x100002600U >> (uVar21 & 0x3f) & 1) == 0) {
          if (uVar21 == 0) goto LAB_0016c241;
          break;
        }
LAB_0016c1f7:
        pbVar14 = pbVar14 + 1;
        ctxt->cur = pbVar14;
      }
    }
    xmlCompileStepPattern(ctxt);
    if (ctxt->error != 0) goto LAB_0016c248;
    pbVar14 = ctxt->cur;
    bVar8 = *pbVar14;
  } while (bVar8 == 0x2f);
LAB_0016c239:
  if (bVar8 != 0) goto LAB_0016c241;
LAB_0016c248:
  pxVar24 = comp;
  if (ctxt->error == 0) {
    *(undefined4 *)&ctxt->namespaces = 0xffffffff;
    *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
    ctxt->nb_namespaces = -1;
    *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
    *(undefined4 *)&ctxt->comp = 0xffffffff;
    *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->elem = 0xffffffff;
    *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
    ctxt->error = -1;
    *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
    *(undefined4 *)&ctxt->dict = 0xffffffff;
    *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->cur = 0xffffffff;
    *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->base = 0xffffffff;
    *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
    (*xmlFree)(ctxt);
    if (uVar23 == 0) {
      uVar23 = 0;
    }
    else {
      if (local_6c == 0x200) {
        uVar10 = (uint)p_Var12->flags >> 8 & 1;
        local_6c = 0x200;
        uVar23 = uVar10;
LAB_0016c2fb:
        uVar23 = uVar23 ^ 1;
        if (uVar10 != 0) goto LAB_0016c545;
      }
      else {
        if (local_6c == 0x100) {
          uVar10 = p_Var12->flags & 0x200;
          local_6c = 0x100;
          uVar23 = uVar10 >> 9;
          goto LAB_0016c2fb;
        }
        uVar23 = 1;
        if (local_6c == 0) {
          local_6c = p_Var12->flags & 0x300;
        }
      }
      pxVar13 = p_Var12->steps;
      if (pxVar13 != (xmlStepOpPtr)0x0) {
        if ((((p_Var12->nbStep == 1) && (pxVar13->op == XML_OP_ELEM)) &&
            (pxVar13->value == (xmlChar *)0x0)) && (pxVar13->value2 == (xmlChar *)0x0)) {
          pxVar15 = xmlNewStreamComp(0);
          if (pxVar15 != (xmlStreamCompPtr)0x0) {
            pbVar14 = (byte *)((long)&pxVar15->flags + 1);
            *pbVar14 = *pbVar14 | 0x40;
            p_Var12->stream = pxVar15;
          }
        }
        else {
          pxVar15 = xmlNewStreamComp(p_Var12->nbStep / 2 + 1);
          if (pxVar15 != (xmlStreamCompPtr)0x0) {
            dict_00 = p_Var12->dict;
            if (dict_00 != (xmlDictPtr)0x0) {
              pxVar15->dict = dict_00;
              xmlDictReference(dict_00);
            }
            uVar10 = p_Var12->flags;
            if ((uVar10 >> 8 & 1) != 0) {
              pbVar14 = (byte *)((long)&pxVar15->flags + 1);
              *pbVar14 = *pbVar14 | 0x80;
            }
            uVar21 = (ulong)(uint)p_Var12->nbStep;
            if (p_Var12->nbStep < 1) {
              uVar11 = 0;
LAB_0016c505:
              bVar4 = true;
              if ((uVar10 & 7) == 0) {
                if (((uint)pxVar15->flags >> 0x10 & 1) == 0) {
                  pxVar15->flags = pxVar15->flags | 0x10000;
                }
                if (0 < pxVar15->nbStep) {
                  uVar10 = pxVar15->steps->flags;
                  if ((uVar10 & 1) == 0) {
                    pxVar15->steps->flags = uVar10 | 1;
                  }
                }
              }
            }
            else {
              uVar10 = 0xffffffff;
              lVar25 = 0;
              uVar11 = 0;
              in_R8 = (xmlChar *)0x0;
              bVar4 = false;
              do {
                pxVar13 = p_Var12->steps;
                while( true ) {
                  if (pxVar13[lVar25].op != XML_OP_ROOT) break;
                  if (lVar25 != 0) goto LAB_0016c531;
                  bVar4 = true;
                  lVar25 = 1;
                  if ((int)uVar21 < 2) goto LAB_0016c4ff;
                }
                flags_00 = (uint)in_R8;
                switch(pxVar13[lVar25].op) {
                case XML_OP_ELEM:
                  pxVar20 = pxVar13[lVar25].value;
                  pxVar19 = pxVar13[lVar25].value2;
                  if (pxVar20 != (xmlChar *)0x0 || pxVar19 != (xmlChar *)0x0) goto LAB_0016c4cd;
                  if (in_R8 != (xmlChar *)0x0 && lVar25 + 1U == (uVar21 & 0xffffffff)) {
                    pbVar14 = (byte *)((long)&pxVar15->flags + 1);
                    *pbVar14 = *pbVar14 | 0x40;
                    in_R8 = (xmlChar *)(ulong)(flags_00 | 0x10);
                    uVar11 = xmlStreamCompAddStep
                                       (pxVar15,(xmlChar *)0x0,(xmlChar *)0x0,100,flags_00 | 0x10);
                    if ((int)uVar11 < 0) goto LAB_0016c531;
                    in_R8 = (xmlChar *)0x0;
                    if (uVar10 != 0xffffffff) {
                      pxVar15->steps[uVar10].flags = pxVar15->steps[uVar10].flags | 0x20;
                    }
                    uVar10 = 0xffffffff;
                  }
                  break;
                case XML_OP_CHILD:
                  pxVar20 = pxVar13[lVar25].value;
                  pxVar19 = pxVar13[lVar25].value2;
                  goto LAB_0016c4cd;
                case XML_OP_ATTR:
                  in_R8 = (xmlChar *)(ulong)(flags_00 | 8);
                  uVar11 = xmlStreamCompAddStep
                                     (pxVar15,pxVar13[lVar25].value,pxVar13[lVar25].value2,2,
                                      flags_00 | 8);
                  if (-1 < (int)uVar11) {
                    uVar10 = 0xffffffff;
                    goto LAB_0016c4e3;
                  }
                  goto LAB_0016c531;
                case XML_OP_ANCESTOR:
                  if (in_R8 == (xmlChar *)0x0) {
                    in_R8 = &DAT_00000001;
                    if (((uint)pxVar15->flags >> 0x10 & 1) == 0) {
                      pxVar15->flags = pxVar15->flags | 0x10000;
                    }
                  }
                  break;
                case XML_OP_NS:
                  pxVar19 = pxVar13[lVar25].value;
                  pxVar20 = (xmlChar *)0x0;
                  goto LAB_0016c4cd;
                case XML_OP_ALL:
                  pxVar20 = (xmlChar *)0x0;
                  pxVar19 = (xmlChar *)0x0;
LAB_0016c4cd:
                  uVar10 = xmlStreamCompAddStep(pxVar15,pxVar20,pxVar19,1,flags_00);
                  uVar11 = uVar10;
                  if ((int)uVar10 < 0) goto LAB_0016c531;
LAB_0016c4e3:
                  in_R8 = (xmlChar *)0x0;
                }
                lVar25 = lVar25 + 1;
                uVar21 = (ulong)p_Var12->nbStep;
              } while (lVar25 < (long)uVar21);
              if (!bVar4) {
                uVar10 = p_Var12->flags;
                goto LAB_0016c505;
              }
LAB_0016c4ff:
              bVar4 = false;
            }
            if ((int)uVar11 < pxVar15->nbStep) {
              pxVar3 = pxVar15->steps;
              pxVar3[uVar11].flags = pxVar3[uVar11].flags | 2;
              if (!bVar4) {
                *(byte *)&pxVar3->flags = (byte)pxVar3->flags | 4;
              }
              p_Var12->stream = pxVar15;
            }
            else {
LAB_0016c531:
              xmlFreeStreamComp(pxVar15);
            }
          }
        }
      }
    }
LAB_0016c545:
    uVar10 = p_Var12->nbStep;
    pxVar13 = p_Var12->steps;
    if ((0 < (int)uVar10) && (pxVar13->op == XML_OP_ANCESTOR)) {
      uVar11 = 0;
      if (uVar10 != 1) {
        uVar21 = (ulong)(uVar10 - 1);
        ppxVar16 = &pxVar13[1].value;
        do {
          ppxVar16[-3] = *ppxVar16;
          ppxVar16[-2] = ppxVar16[1];
          *(xmlPatOp *)(ppxVar16 + -4) = ((xmlStepOp *)(ppxVar16 + -1))->op;
          ppxVar16 = ppxVar16 + 3;
          uVar21 = uVar21 - 1;
          uVar11 = uVar10 - 1;
        } while (uVar21 != 0);
      }
      uVar10 = uVar11;
      p_Var12->nbStep = uVar10;
    }
    if ((int)uVar10 < p_Var12->maxStep) {
LAB_0016c5b7:
      if ((int)uVar10 < 2) {
        uVar21 = (ulong)(int)uVar10;
      }
      else {
        uVar21 = (ulong)uVar10;
        ppxVar16 = &pxVar13->value;
        ppxVar22 = &pxVar13[uVar21 - 1].value;
        lVar25 = 0;
        pxVar20 = (xmlChar *)(uVar21 - 2);
        do {
          pxVar19 = *ppxVar16;
          pxVar5 = ppxVar16[1];
          pxVar6 = ppxVar22[1];
          *ppxVar16 = *ppxVar22;
          ppxVar16[1] = pxVar6;
          *ppxVar22 = pxVar19;
          ppxVar22[1] = pxVar5;
          xVar2 = ((xmlStepOp *)(ppxVar16 + -1))->op;
          ((xmlStepOp *)(ppxVar16 + -1))->op = ((xmlStepOp *)(ppxVar22 + -1))->op;
          ((xmlStepOp *)(ppxVar22 + -1))->op = xVar2;
          lVar25 = lVar25 + 1;
          ppxVar16 = ppxVar16 + 3;
          in_R8 = pxVar20 + -1;
          ppxVar22 = ppxVar22 + -3;
          bVar4 = lVar25 < (long)pxVar20;
          pxVar20 = in_R8;
        } while (bVar4);
      }
      pxVar13[uVar21].value = (xmlChar *)0x0;
      pxVar13[uVar21].value2 = (xmlChar *)0x0;
      p_Var12->nbStep = uVar10 + 1;
      pxVar13[uVar21].op = XML_OP_END;
      if (local_58 != (xmlChar *)0x0) {
        (*xmlFree)(local_58);
      }
      xVar7 = *pattern;
      if (xVar7 == '\0') {
        p_Var12 = comp;
        if (comp != (xmlPatternPtr)0x0 && (char)uVar23 == '\0') {
          do {
            if (p_Var12->stream != (xmlStreamCompPtr)0x0) {
              xmlFreeStreamComp(p_Var12->stream);
              p_Var12->stream = (xmlStreamCompPtr)0x0;
            }
            pp_Var1 = &p_Var12->next;
            p_Var12 = *pp_Var1;
          } while (*pp_Var1 != (_xmlPattern *)0x0);
          return comp;
        }
        return comp;
      }
      goto LAB_0016bc04;
    }
    pxVar13 = (xmlStepOpPtr)(*xmlRealloc)(pxVar13,(long)p_Var12->maxStep * 0x30);
    if (pxVar13 != (xmlStepOpPtr)0x0) {
      p_Var12->steps = pxVar13;
      p_Var12->maxStep = p_Var12->maxStep << 1;
      uVar10 = p_Var12->nbStep;
      goto LAB_0016c5b7;
    }
  }
  else {
LAB_0016c6c1:
    *(undefined4 *)&ctxt->namespaces = 0xffffffff;
    *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
    ctxt->nb_namespaces = -1;
    *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
    *(undefined4 *)&ctxt->comp = 0xffffffff;
    *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->elem = 0xffffffff;
    *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
    ctxt->error = -1;
    *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
    *(undefined4 *)&ctxt->dict = 0xffffffff;
    *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->cur = 0xffffffff;
    *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->base = 0xffffffff;
    *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
    (*xmlFree)(ctxt);
LAB_0016c6e9:
    comp = pxVar24;
    if (pxVar24 == (xmlPatternPtr)0x0) goto LAB_0016c6f9;
  }
  xmlFreePatternList(comp);
LAB_0016c6f9:
  if (local_58 == (xmlChar *)0x0) {
    return (xmlPatternPtr)0x0;
  }
  (*xmlFree)(local_58);
  return (xmlPatternPtr)0x0;
}

Assistant:

xmlPatternPtr
xmlPatterncompile(const xmlChar *pattern, xmlDict *dict, int flags,
                  const xmlChar **namespaces) {
    xmlPatternPtr ret = NULL, cur;
    xmlPatParserContextPtr ctxt = NULL;
    const xmlChar *or, *start;
    xmlChar *tmp = NULL;
    int type = 0;
    int streamable = 1;

    if (pattern == NULL)
        return(NULL);

    start = pattern;
    or = start;
    while (*or != 0) {
	tmp = NULL;
	while ((*or != 0) && (*or != '|')) or++;
        if (*or == 0)
	    ctxt = xmlNewPatParserContext(start, dict, namespaces);
	else {
	    tmp = xmlStrndup(start, or - start);
	    if (tmp != NULL) {
		ctxt = xmlNewPatParserContext(tmp, dict, namespaces);
	    }
	    or++;
	}
	if (ctxt == NULL) goto error;
	cur = xmlNewPattern();
	if (cur == NULL) goto error;
	/*
	* Assign string dict.
	*/
	if (dict) {
	    cur->dict = dict;
	    xmlDictReference(dict);
	}
	if (ret == NULL)
	    ret = cur;
	else {
	    cur->next = ret->next;
	    ret->next = cur;
	}
	cur->flags = flags;
	ctxt->comp = cur;

	if (XML_STREAM_XS_IDC(cur))
	    xmlCompileIDCXPathPath(ctxt);
	else
	    xmlCompilePathPattern(ctxt);
	if (ctxt->error != 0)
	    goto error;
	xmlFreePatParserContext(ctxt);
	ctxt = NULL;


        if (streamable) {
	    if (type == 0) {
	        type = cur->flags & (PAT_FROM_ROOT | PAT_FROM_CUR);
	    } else if (type == PAT_FROM_ROOT) {
	        if (cur->flags & PAT_FROM_CUR)
		    streamable = 0;
	    } else if (type == PAT_FROM_CUR) {
	        if (cur->flags & PAT_FROM_ROOT)
		    streamable = 0;
	    }
	}
	if (streamable)
	    xmlStreamCompile(cur);
	if (xmlReversePattern(cur) < 0)
	    goto error;
	if (tmp != NULL) {
	    xmlFree(tmp);
	    tmp = NULL;
	}
	start = or;
    }
    if (streamable == 0) {
        cur = ret;
	while (cur != NULL) {
	    if (cur->stream != NULL) {
		xmlFreeStreamComp(cur->stream);
		cur->stream = NULL;
	    }
	    cur = cur->next;
	}
    }

    return(ret);
error:
    if (ctxt != NULL) xmlFreePatParserContext(ctxt);
    if (ret != NULL) xmlFreePattern(ret);
    if (tmp != NULL) xmlFree(tmp);
    return(NULL);
}